

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::short_filename_formatter<spdlog::details::null_scoped_padder>::format
          (short_filename_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_2,memory_buf_t *dest)

{
  bool bVar1;
  fmt_helper *this_00;
  memory_buf_t *dest_00;
  string_view_t view;
  size_t local_78;
  null_scoped_padder local_51;
  size_t sStack_50;
  null_scoped_padder p;
  size_t text_size;
  char *filename;
  memory_buf_t *pmStack_38;
  null_scoped_padder p_1;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  short_filename_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  pmStack_38 = dest;
  bVar1 = source_loc::empty(&msg->source);
  if (bVar1) {
    null_scoped_padder::null_scoped_padder
              ((null_scoped_padder *)((long)&filename + 7),0,&(this->super_flag_formatter).padinfo_,
               pmStack_38);
  }
  else {
    this_00 = (fmt_helper *)basename((msg->source).filename);
    bVar1 = padding_info::enabled(&(this->super_flag_formatter).padinfo_);
    if (bVar1) {
      local_78 = std::char_traits<char>::length((char_type *)this_00);
    }
    else {
      local_78 = 0;
    }
    sStack_50 = local_78;
    null_scoped_padder::null_scoped_padder
              (&local_51,local_78,&(this->super_flag_formatter).padinfo_,pmStack_38);
    dest_00 = (memory_buf_t *)std::char_traits<char>::length((char_type *)this_00);
    view.size_ = (size_t)pmStack_38;
    view.data_ = (char *)dest_00;
    fmt_helper::append_string_view(this_00,view,dest_00);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }
        auto filename = basename(msg.source.filename);
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(filename) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(filename, dest);
    }